

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::round_fp_tex_coords(CompilerMSL *this,string *tex_coords,bool coord_is_fp)

{
  byte in_CL;
  undefined7 in_register_00000011;
  string local_48 [39];
  byte local_21;
  string *psStack_20;
  bool coord_is_fp_local;
  string *tex_coords_local;
  CompilerMSL *this_local;
  
  psStack_20 = (string *)CONCAT71(in_register_00000011,coord_is_fp);
  local_21 = in_CL & 1;
  tex_coords_local = tex_coords;
  this_local = this;
  if (local_21 == 0) {
    ::std::__cxx11::string::string((string *)this,psStack_20);
  }
  else {
    ::std::operator+((char *)local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"round(");
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_48);
    ::std::__cxx11::string::~string(local_48);
  }
  return this;
}

Assistant:

string CompilerMSL::round_fp_tex_coords(string tex_coords, bool coord_is_fp)
{
	return coord_is_fp ? ("round(" + tex_coords + ")") : tex_coords;
}